

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArraySet(InternalAnalyzer *this,ArraySet *curr)

{
  bool bVar1;
  ArraySet *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x10) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->writesArray = true;
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesArray = true;
      // traps when the arg is null or the index out of bounds
      parent.implicitTrap = true;
    }